

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm2.c
# Opt level: O2

int sm2_bn_asn1_encode(uint8_t *asn1,int *make,uint8_t *bn)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  size_t __n;
  uint8_t *__dest;
  
  if (bn == (uint8_t *)0x0 || (make == (int *)0x0 || asn1 == (uint8_t *)0x0)) {
    return 0;
  }
  iVar2 = 0;
  for (lVar3 = -0x20; bVar1 = bn[lVar3 + 0x20], bVar1 == 0; lVar3 = lVar3 + 1) {
    iVar2 = iVar2 + 1;
  }
  if ((int)((uint)(bVar1 >> 7) - (int)lVar3) < 0) {
    iVar2 = 0;
  }
  else {
    *asn1 = '\x02';
    asn1[1] = -(char)lVar3 - ((char)bVar1 >> 7);
    if ((char)bn[lVar3 + 0x20] < '\0') {
      asn1[2] = '\0';
      __dest = asn1 + 3;
      __n = (size_t)(int)(((uint)(bVar1 >> 7) - iVar2) + 0x1f);
    }
    else {
      __dest = asn1 + 2;
      __n = (size_t)((uint)(bVar1 >> 7) - (int)lVar3);
    }
    memcpy(__dest,bn + lVar3 + 0x20,__n);
    *make = ((uint)(bVar1 >> 7) - iVar2) + 0x22;
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int sm2_bn_asn1_encode(uint8_t asn1[35], int *make, uint8_t bn[32])
{
    int ret = GML_ERROR;
    int zeros = 0;
    int len;

    if (asn1 == NULL || make == NULL || bn == NULL)
        goto end;

    while (*bn == 0) {
        zeros++;
        bn++;
    }

    len = 0x20 - zeros + (int)(bn[0] >= 0x80U); // bn is considered as negative if bn[0] >= 0x80
    if (len < 0)
        goto end;

    asn1[0] = 0x02U;
    asn1[1] = (uint8_t)len;
    asn1 += 2;
    if (bn[0] >= 0x80U) {
        *asn1 = 0x00U;
        asn1++;
        memcpy(asn1, bn, len - 1); // asn1 = 02 ?? bn
    }
    else {
        memcpy(asn1, bn, len); // asn1 = 02 ?? bn
    }
    *make = (len + 2);

    ret = GML_OK;
end:
    return ret;
}